

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O0

int Cec3_ManSweepNode(Cec3_Man_t *p,int iObj)

{
  Gia_Man_t *p_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  abctime aVar8;
  int local_68;
  int fCompl;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj;
  int RetValue;
  int status;
  int IdSat;
  int IdAig;
  int i;
  abctime clk;
  int iObj_local;
  Cec3_Man_t *p_local;
  
  aVar5 = Abc_Clock();
  pGVar6 = Gia_ManObj(p->pAig,iObj);
  pGVar7 = Gia_ObjReprObj(p->pAig,iObj);
  uVar1 = Abc_LitIsCompl(pGVar6->Value);
  uVar2 = Abc_LitIsCompl(pGVar7->Value);
  uVar1 = uVar1 ^ uVar2 ^ (uint)((ulong)*(undefined8 *)pGVar6 >> 0x3f) ^
          (uint)((ulong)*(undefined8 *)pGVar7 >> 0x3f);
  iVar3 = Abc_Lit2Var(pGVar7->Value);
  iVar4 = Abc_Lit2Var(pGVar6->Value);
  iVar3 = Cec3_ManSolveTwo(p,iVar3,iVar4,uVar1);
  if (iVar3 == 1) {
    p->nSatSat = p->nSatSat + 1;
    p->nPatterns = p->nPatterns + 1;
    if (p->pAig->iPatsPi == p->pAig->nSimWords * 0x40 + -1) {
      local_68 = 1;
    }
    else {
      local_68 = p->pAig->iPatsPi + 1;
    }
    p->pAig->iPatsPi = local_68;
    if ((p->pAig->iPatsPi < 1) || (p->pAig->nSimWords * 0x40 <= p->pAig->iPatsPi)) {
      __assert_fail("p->pAig->iPatsPi > 0 && p->pAig->iPatsPi < 64 * p->pAig->nSimWords",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                    ,0x36a,"int Cec3_ManSweepNode(Cec3_Man_t *, int)");
    }
    for (IdSat = 0; iVar3 = Vec_IntSize(p->vObjSatPairs), IdSat + 1 < iVar3; IdSat = IdSat + 2) {
      iVar3 = Vec_IntEntry(p->vObjSatPairs,IdSat);
      iVar4 = Vec_IntEntry(p->vObjSatPairs,IdSat + 1);
      p_00 = p->pAig;
      iVar4 = bmcg_sat_solver_read_cex_varvalue(p->pSat,iVar4);
      Cec3_ObjSimSetInputBit(p_00,iVar3,iVar4);
    }
    aVar8 = Abc_Clock();
    p->timeSatSat = (aVar8 - aVar5) + p->timeSatSat;
    pObj._4_4_ = 0;
  }
  else if (iVar3 == -1) {
    p->nSatUnsat = p->nSatUnsat + 1;
    uVar1 = Abc_LitNotCond(pGVar7->Value,uVar1);
    pGVar6->Value = uVar1;
    Gia_ObjSetProved(p->pAig,iObj);
    aVar8 = Abc_Clock();
    p->timeSatUnsat = (aVar8 - aVar5) + p->timeSatUnsat;
    pObj._4_4_ = 1;
  }
  else {
    p->nSatUndec = p->nSatUndec + 1;
    if (iVar3 != 0) {
      __assert_fail("status == GLUCOSE_UNDEC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/cec/cecSatG.c"
                    ,0x37c,"int Cec3_ManSweepNode(Cec3_Man_t *, int)");
    }
    Gia_ObjSetFailed(p->pAig,iObj);
    aVar8 = Abc_Clock();
    p->timeSatUndec = (aVar8 - aVar5) + p->timeSatUndec;
    pObj._4_4_ = 2;
  }
  if (p->pPars->fUseCones == 0) {
    aVar5 = Abc_Clock();
    bmcg_sat_solver_reset(p->pSat);
    aVar8 = Abc_Clock();
    p->timeExtra = (aVar8 - aVar5) + p->timeExtra;
  }
  return pObj._4_4_;
}

Assistant:

int Cec3_ManSweepNode( Cec3_Man_t * p, int iObj )
{
    abctime clk = Abc_Clock();
    int i, IdAig, IdSat, status, RetValue = 1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pAig, iObj );
    Gia_Obj_t * pRepr = Gia_ObjReprObj( p->pAig, iObj );
    int fCompl = Abc_LitIsCompl(pObj->Value) ^ Abc_LitIsCompl(pRepr->Value) ^ pObj->fPhase ^ pRepr->fPhase;
    status = Cec3_ManSolveTwo( p, Abc_Lit2Var(pRepr->Value), Abc_Lit2Var(pObj->Value), fCompl );
    if ( status == GLUCOSE_SAT )
    {
        p->nSatSat++;
        p->nPatterns++;
        p->pAig->iPatsPi = (p->pAig->iPatsPi == 64 * p->pAig->nSimWords - 1) ? 1 : p->pAig->iPatsPi + 1;
        assert( p->pAig->iPatsPi > 0 && p->pAig->iPatsPi < 64 * p->pAig->nSimWords );
        Vec_IntForEachEntryDouble( p->vObjSatPairs, IdAig, IdSat, i )
//            Cec3_ObjSimSetInputBit( p->pAig, IdAig, satoko_var_polarity(p->pSat, IdSat) == SATOKO_LIT_TRUE );
            Cec3_ObjSimSetInputBit( p->pAig, IdAig, bmcg_sat_solver_read_cex_varvalue(p->pSat, IdSat) );
        p->timeSatSat += Abc_Clock() - clk;
        RetValue = 0;
    }
    else if ( status == GLUCOSE_UNSAT )
    {
        p->nSatUnsat++;
        pObj->Value = Abc_LitNotCond( pRepr->Value, fCompl );
        Gia_ObjSetProved( p->pAig, iObj );
        p->timeSatUnsat += Abc_Clock() - clk;
        RetValue = 1;
    }
    else 
    {
        p->nSatUndec++;
        assert( status == GLUCOSE_UNDEC );
        Gia_ObjSetFailed( p->pAig, iObj );
        p->timeSatUndec += Abc_Clock() - clk;
        RetValue = 2;
    }
    if ( p->pPars->fUseCones )
        return RetValue;
    clk = Abc_Clock();
    bmcg_sat_solver_reset( p->pSat );
    p->timeExtra += Abc_Clock() - clk;
//    satoko_stats(p->pSat)->n_conflicts = 0;
    return RetValue;
}